

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O3

void rw::ps2::unswizzleRaster(Raster *raster)

{
  uint uVar1;
  uint8 *puVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  bool bVar16;
  bool bVar17;
  uint8 tmpbuf [4096];
  byte local_1038 [4104];
  
  uVar15 = raster->format;
  if ((uVar15 & 0x6000) != 0) {
    bVar10 = *(byte *)((long)&raster->pixels + (long)nativeRasterOffset + 4);
    if (((uVar15 >> 0xe & 1) == 0) && ((bVar10 & 2) != 0)) {
      uVar11 = 4;
      iVar13 = 0x10;
    }
    else {
      bVar16 = (uVar15 >> 0xe & 1) != 0;
      bVar17 = (bVar10 & 4) != 0;
      iVar13 = 0x20;
      if (!bVar17 || !bVar16) {
        iVar13 = 8;
      }
      bVar17 = bVar17 && bVar16;
      uVar11 = (uint)bVar17 + (uint)bVar17 * 2 + 1;
    }
    if (iVar13 < raster->width) {
      iVar13 = raster->width;
    }
    if ((int)uVar11 < raster->height) {
      uVar11 = raster->height;
    }
    puVar2 = raster->pixels;
    iVar4 = 1;
    bVar9 = 1;
    do {
      bVar8 = bVar9;
      iVar4 = iVar4 * 2;
      bVar9 = bVar8 + 1;
    } while (iVar4 < iVar13);
    uVar14 = (8 << (bVar8 - 1 & 0x1f)) - 1;
    if (((uVar15 >> 0xe & 1) == 0) || ((bVar10 & 4) == 0)) {
      if (((uVar15 >> 0xd & 1) != 0) && ((bVar10 & 2) != 0)) {
        uVar15 = 0;
        do {
          memcpy(local_1038,puVar2 + (int)(uVar15 << (bVar8 & 0x1f)),(ulong)(uint)(iVar13 * 4));
          uVar3 = 0;
          do {
            uVar5 = uVar3 | uVar15;
            uVar6 = 0;
            do {
              puVar2[(uVar5 << (bVar8 & 0x1f)) + (uint)uVar6] =
                   local_1038
                   [(((uint)(uVar6 >> 2) & 2 | (uVar3 & 2) >> 1) +
                     ((uint)(uVar6 >> 1) & 0x3ffffff8 | (uint)uVar6 & 7 ^ (uVar5 * 2 ^ uVar15) & 4)
                     * 4 | (uVar5 >> 1 & 0x3ffffffe | uVar3 & 1) << (bVar9 & 0x1f)) & uVar14];
              uVar6 = uVar6 + 1;
            } while (iVar13 + (uint)(iVar13 == 0) != uVar6);
            uVar3 = uVar3 + 1;
          } while (uVar3 != 4);
          uVar15 = uVar15 + 4;
        } while (uVar15 < uVar11);
      }
    }
    else {
      uVar15 = 0;
      do {
        memcpy(local_1038,puVar2 + (int)(uVar15 << (bVar8 - 1 & 0x1f)),(ulong)(uint)(iVar13 * 2));
        uVar3 = 0;
        do {
          uVar7 = uVar3 | uVar15;
          uVar5 = 0;
          do {
            uVar1 = (uVar7 << (bVar8 & 0x1f)) + uVar5;
            uVar12 = (uVar5 >> 2 & 2 | (uVar3 & 2) >> 1) +
                     (uVar5 >> 1 & 0x3ffffff8 | uVar5 & 7 ^ (uVar7 * 2 ^ uVar15) & 4) * 4 |
                     (uVar7 >> 1 & 0x3ffffffe | uVar3 & 1) << (bVar9 & 0x1f);
            bVar10 = local_1038[(uVar12 & uVar14) >> 1] >> 4;
            if ((uVar12 & 1) == 0) {
              bVar10 = local_1038[(uVar12 & uVar14) >> 1] & 0xf;
            }
            uVar12 = uVar1 >> 1;
            if ((uVar1 & 1) == 0) {
              bVar10 = puVar2[uVar12] & 0xf0 | bVar10;
            }
            else {
              bVar10 = bVar10 << 4 | puVar2[uVar12] & 0xf;
            }
            puVar2[uVar12] = bVar10;
            uVar5 = uVar5 + 1;
          } while (iVar13 + (uint)(iVar13 == 0) != uVar5);
          uVar3 = uVar3 + 1;
        } while (uVar3 != 4);
        uVar15 = uVar15 + 4;
      } while (uVar15 < uVar11);
    }
  }
  return;
}

Assistant:

void
unswizzleRaster(Raster *raster)
{
	uint8 tmpbuf[1024*4];	// 1024x4px, maximum possible width
	uint32 mask;
	int32 x, y, w, h;
	int32 i;
	int32 logw;
	Ps2Raster *natras = GETPS2RASTEREXT(raster);
	uint8 *px;

	if((raster->format & (Raster::PAL4|Raster::PAL8)) == 0)
		return;

	int minw, minh;
	transferMinSize(raster->format & Raster::PAL4 ? PSMT4 : PSMT8, natras->flags, &minw, &minh);
	w = max(raster->width, minw);
	h = max(raster->height, minh);
	px = raster->pixels;
	logw = 0;
	for(i = 1; i < w; i *= 2) logw++;
	mask = (1<<(logw+2))-1;

	if(raster->format & Raster::PAL4 && natras->flags & Ps2Raster::SWIZZLED4){
		for(y = 0; y < h; y += 4){
			memcpy(tmpbuf, &px[y<<(logw-1)], 2*w);
			for(i = 0; i < 4; i++)
				for(x = 0; x < w; x++){
					uint32 a = ((y+i)<<logw)+x;
					uint32 s = swizzle(x, y+i, logw)&mask;
					uint8 c = s & 1 ? tmpbuf[s>>1] >> 4 : tmpbuf[s>>1] & 0xF;
					px[a>>1] = a & 1 ? (px[a>>1]&0xF) | c<<4 : (px[a>>1]&0xF0) | c;
				}
		}
	}else if(raster->format & Raster::PAL8 && natras->flags & Ps2Raster::SWIZZLED8){
		for(y = 0; y < h; y += 4){
			memcpy(tmpbuf, &px[y<<logw], 4*w);
			for(i = 0; i < 4; i++)
				for(x = 0; x < w; x++){
					uint32 a = ((y+i)<<logw)+x;
					uint32 s = swizzle(x, y+i, logw)&mask;
					px[a] = tmpbuf[s];
				}
		}
	}
}